

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O3

string * __thiscall
cmake::ReportCapabilities_abi_cxx11_(string *__return_storage_ptr__,cmake *this,bool haveServerMode)

{
  size_t in_RCX;
  FastWriter writer;
  undefined1 local_98 [72];
  FastWriter local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  Json::FastWriter::FastWriter(&local_50);
  ReportCapabilitiesJson((Value *)(local_98 + 0x20),this,haveServerMode);
  Json::FastWriter::write_abi_cxx11_((FastWriter *)local_98,(int)&local_50,local_98 + 0x20,in_RCX);
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_98);
  if ((undefined1 *)local_98._0_8_ != local_98 + 0x10) {
    operator_delete((void *)local_98._0_8_,local_98._16_8_ + 1);
  }
  Json::Value::~Value((Value *)(local_98 + 0x20));
  Json::FastWriter::~FastWriter(&local_50);
  return __return_storage_ptr__;
}

Assistant:

std::string cmake::ReportCapabilities(bool haveServerMode) const
{
  std::string result;
#if defined(CMAKE_BUILD_WITH_CMAKE)
  Json::FastWriter writer;
  result = writer.write(this->ReportCapabilitiesJson(haveServerMode));
#else
  result = "Not supported";
#endif
  return result;
}